

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O0

void __thiscall
wasm::ReconstructStringifyWalker::ReconstructStringifyWalker
          (ReconstructStringifyWalker *this,Module *wasm,Function *func)

{
  Function *func_local;
  Module *wasm_local;
  ReconstructStringifyWalker *this_local;
  
  StringifyWalker<wasm::ReconstructStringifyWalker>::StringifyWalker
            (&this->super_StringifyWalker<wasm::ReconstructStringifyWalker>);
  this->state = NotInSeq;
  std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::vector
            (&this->sequences);
  this->seqCounter = 0;
  this->instrCounter = 0;
  IRBuilder::IRBuilder(&this->existingBuilder,wasm);
  IRBuilder::IRBuilder(&this->outlinedBuilder,wasm);
  this->func = func;
  Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  ::setModule((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
               *)this,wasm);
  return;
}

Assistant:

ReconstructStringifyWalker(Module* wasm, Function* func)
    : existingBuilder(*wasm), outlinedBuilder(*wasm), func(func) {
    this->setModule(wasm);
    ODBG(std::cerr << "\nexistingBuilder: " << &existingBuilder
                   << " outlinedBuilder: " << &outlinedBuilder << "\n");
  }